

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *this)

{
  ctrl_t *pcVar1;
  size_type *psVar2;
  size_type *psVar3;
  ulong *puVar4;
  char cVar5;
  ctrl_t *pcVar6;
  slot_type *psVar7;
  size_type sVar8;
  slot_type *psVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  size_type sVar12;
  unsigned_long uVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  byte bVar18;
  ulong hash;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  FindInfo FVar21;
  type raw;
  ulong *local_58;
  ulong local_48;
  ulong uStack_40;
  int local_38;
  
  pcVar6 = this->ctrl_;
  sVar14 = this->capacity_;
  pcVar1 = pcVar6 + sVar14 + 1;
  if (pcVar1 != pcVar6) {
    lVar16 = 0;
    auVar19[8] = 0x7e;
    auVar19._0_8_ = 0x7e7e7e7e7e7e7e7e;
    auVar19[9] = 0x7e;
    auVar19[10] = 0x7e;
    auVar19[0xb] = 0x7e;
    auVar19[0xc] = 0x7e;
    auVar19[0xd] = 0x7e;
    auVar19[0xe] = 0x7e;
    auVar19[0xf] = 0x7e;
    auVar20._8_8_ = 0x8080808080808080;
    auVar20._0_8_ = 0x8080808080808080;
    do {
      auVar10 = vpshufb_avx(auVar19,*(undefined1 (*) [16])(pcVar6 + lVar16));
      auVar10 = vpor_avx(auVar10,auVar20);
      *(undefined1 (*) [16])(pcVar6 + lVar16) = auVar10;
      lVar16 = lVar16 + 0x10;
    } while (sVar14 + 1 != lVar16);
  }
  uVar11 = *(undefined8 *)(pcVar6 + 8);
  *(undefined8 *)pcVar1 = *(undefined8 *)pcVar6;
  *(undefined8 *)(pcVar1 + 8) = uVar11;
  pcVar6[sVar14] = -1;
  uVar15 = this->capacity_;
  if (uVar15 != 0) {
    uVar17 = 0;
    do {
      if (this->ctrl_[uVar17] == -2) {
        if ((this->settings_).
            super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
            .
            super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
            .value.super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        uVar13 = (*(this->settings_).
                   super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                   .
                   super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
                   .value._M_invoker)
                           ((_Any_data *)
                            &(this->settings_).
                             super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                             .
                             super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
                            ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (this->slots_ + uVar17));
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar13;
        hash = SUB168(auVar10 * ZEXT816(0xde5fb9d2630458e9),8) +
               SUB168(auVar10 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar21 = find_first_non_full(this,hash);
        sVar14 = FVar21.offset;
        uVar15 = hash >> 7 & this->capacity_;
        if (((uVar17 - uVar15 ^ sVar14 - uVar15) & this->capacity_) < 0x10) {
          bVar18 = (byte)hash & 0x7f;
          this->ctrl_[uVar17] = bVar18;
          this->ctrl_[(ulong)((uint)this->capacity_ & 0xf) + 1 + (uVar17 - 0x10 & this->capacity_)]
               = bVar18;
        }
        else {
          cVar5 = this->ctrl_[sVar14];
          bVar18 = (byte)hash & 0x7f;
          this->ctrl_[sVar14] = bVar18;
          this->ctrl_[(ulong)((uint)this->capacity_ & 0xf) + 1 + (sVar14 - 0x10 & this->capacity_)]
               = bVar18;
          psVar7 = this->slots_;
          if (cVar5 == -0x80) {
            psVar9 = psVar7 + sVar14;
            psVar2 = (size_type *)((long)psVar7 + sVar14 * 0x28 + 0x10);
            psVar2[-2] = (size_type)psVar2;
            psVar3 = (size_type *)((long)psVar7 + uVar17 * 0x28 + 0x10);
            if ((size_type *)psVar3[-2] == psVar3) {
              sVar8 = psVar3[1];
              *psVar2 = *psVar3;
              psVar2[1] = sVar8;
            }
            else {
              (psVar9->value).first._M_dataplus._M_p = (pointer)psVar3[-2];
              (psVar9->value).first.field_2._M_allocated_capacity = *psVar3;
            }
            psVar7 = psVar7 + uVar17;
            (psVar9->value).first._M_string_length = (psVar7->value).first._M_string_length;
            *(size_type **)psVar7 = psVar3;
            (psVar7->key)._M_string_length = 0;
            (psVar7->value).first.field_2._M_local_buf[0] = '\0';
            (psVar9->value).second = (psVar7->value).second;
            this->ctrl_[uVar17] = -0x80;
            this->ctrl_
            [(ulong)((uint)this->capacity_ & 0xf) + 1 + (uVar17 - 0x10 & this->capacity_)] = -0x80;
          }
          else {
            puVar4 = (ulong *)((long)psVar7 + uVar17 * 0x28 + 0x10);
            if ((ulong *)puVar4[-2] == puVar4) {
              local_48 = *puVar4;
              uStack_40 = puVar4[1];
              local_58 = &local_48;
            }
            else {
              local_48 = *puVar4;
              local_58 = (ulong *)puVar4[-2];
            }
            psVar7 = psVar7 + uVar17;
            sVar8 = (psVar7->value).first._M_string_length;
            *(ulong **)psVar7 = puVar4;
            (psVar7->key)._M_string_length = 0;
            (psVar7->value).first.field_2._M_local_buf[0] = '\0';
            local_38 = (psVar7->value).second;
            psVar9 = this->slots_;
            psVar7 = psVar9 + uVar17;
            psVar2 = (size_type *)((long)psVar9 + uVar17 * 0x28 + 0x10);
            psVar2[-2] = (size_type)psVar2;
            psVar3 = (size_type *)((long)psVar9 + sVar14 * 0x28 + 0x10);
            if ((size_type *)psVar3[-2] == psVar3) {
              sVar12 = psVar3[1];
              *psVar2 = *psVar3;
              psVar2[1] = sVar12;
            }
            else {
              (psVar7->value).first._M_dataplus._M_p = (pointer)psVar3[-2];
              (psVar7->value).first.field_2._M_allocated_capacity = *psVar3;
            }
            psVar9 = psVar9 + sVar14;
            (psVar7->value).first._M_string_length = (psVar9->value).first._M_string_length;
            *(size_type **)psVar9 = psVar3;
            (psVar9->key)._M_string_length = 0;
            (psVar9->value).first.field_2._M_local_buf[0] = '\0';
            (psVar7->value).second = (psVar9->value).second;
            psVar7 = this->slots_ + sVar14;
            puVar4 = (ulong *)((long)this->slots_ + sVar14 * 0x28 + 0x10);
            puVar4[-2] = (ulong)puVar4;
            if (local_58 == &local_48) {
              *puVar4 = local_48;
              puVar4[1] = uStack_40;
            }
            else {
              (psVar7->value).first._M_dataplus._M_p = (pointer)local_58;
              (psVar7->value).first.field_2._M_allocated_capacity = local_48;
            }
            (psVar7->value).first._M_string_length = sVar8;
            local_48 = local_48 & 0xffffffffffffff00;
            (psVar7->value).second = local_38;
            uVar17 = uVar17 - 1;
          }
        }
      }
      uVar17 = uVar17 + 1;
      uVar15 = this->capacity_;
    } while (uVar17 != uVar15);
  }
  (this->settings_).
  super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_0UL,_false>
  .value = uVar15 - ((uVar15 >> 3) + this->size_);
  return;
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename std::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hash = PolicyTraits::apply(HashElement{hash_ref()},
                                              PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hash);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hash.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hash).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hash));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hash));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hash));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left();
    }